

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::check_collapse_exposure
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  int *piVar1;
  Alloc *pAVar2;
  Mesh *pMVar3;
  Omega_h_Parting OVar4;
  uint uVar5;
  undefined8 uVar6;
  char *pcVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int cell_dim;
  char *pcVar9;
  Read<signed_char> RVar10;
  LOs local_88;
  Read<signed_char> local_78;
  LOs local_68;
  Alloc *local_58;
  void *local_50;
  Alloc *local_48;
  void *pvStack_40;
  Mesh *local_38;
  void *pvVar8;
  
  local_38 = (Mesh *)this;
  OVar4 = Mesh::parting(mesh);
  if (OVar4 == OMEGA_H_GHOSTED) {
    uVar5 = mesh->dim_;
    if (uVar5 < 4) {
      cell_dim = 2;
      do {
        pMVar3 = local_38;
        if ((int)uVar5 < cell_dim) {
          local_88.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
          if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
              local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_88.write_.shared_alloc_.alloc =
                   (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_88.write_.shared_alloc_.alloc)->use_count =
                   (local_88.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_88.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
          local_58 = (cands2edges->write_).shared_alloc_.alloc;
          if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_58 = (Alloc *)(local_58->size * 8 + 1);
            }
            else {
              local_58->use_count = local_58->use_count + 1;
            }
          }
          local_50 = (cands2edges->write_).shared_alloc_.direct_ptr;
          RVar10 = Mesh::sync_subset_array<signed_char>
                             (local_38,(Int)mesh,(Read<signed_char> *)0x1,&local_88,(char)&local_58,
                              0);
          pAVar2 = local_58;
          pvVar8 = RVar10.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
            piVar1 = &local_58->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_58);
              operator_delete(pAVar2,0x48);
              pvVar8 = extraout_RDX;
            }
          }
          pAVar2 = local_88.write_.shared_alloc_.alloc;
          if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
              local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
              pvVar8 = extraout_RDX_00;
            }
          }
          RVar10.write_.shared_alloc_.direct_ptr = pvVar8;
          RVar10.write_.shared_alloc_.alloc = (Alloc *)pMVar3;
          return (Read<signed_char>)RVar10.write_.shared_alloc_;
        }
        local_68.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
            local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_68.write_.shared_alloc_.alloc =
                 (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_68.write_.shared_alloc_.alloc)->use_count =
                 (local_68.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_68.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
        local_78.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
        if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
            local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_78.write_.shared_alloc_.alloc =
                 (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_78.write_.shared_alloc_.alloc)->use_count =
                 (local_78.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_78.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
        check_collapse_exposure((Omega_h *)&local_48,mesh,&local_68,&local_78,cell_dim);
        pAVar2 = (cand_codes->write_).shared_alloc_.alloc;
        if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
          piVar1 = &pAVar2->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar2);
            operator_delete(pAVar2,0x48);
          }
        }
        pAVar2 = local_78.write_.shared_alloc_.alloc;
        (cand_codes->write_).shared_alloc_.alloc = local_48;
        (cand_codes->write_).shared_alloc_.direct_ptr = pvStack_40;
        if ((((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) &&
           (entering_parallel == '\x01')) {
          local_48->use_count = local_48->use_count + -1;
          (cand_codes->write_).shared_alloc_.alloc = (Alloc *)(local_48->size * 8 + 1);
        }
        local_48 = (Alloc *)0x0;
        pvStack_40 = (void *)0x0;
        if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
            local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        pAVar2 = local_68.write_.shared_alloc_.alloc;
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
            local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        cell_dim = cell_dim + 1;
        uVar5 = mesh->dim_;
      } while (uVar5 < 4);
    }
    pcVar9 = "0 <= dim_ && dim_ <= 3";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    uVar6 = 0x33;
  }
  else {
    pcVar9 = "mesh->parting() == OMEGA_H_GHOSTED";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_check_collapse.cpp"
    ;
    uVar6 = 0x6e;
  }
  fail("assertion %s failed at %s +%d\n",pcVar9,pcVar7,uVar6);
}

Assistant:

Read<I8> check_collapse_exposure(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  for (Int cell_dim = Int(EDGE) + 1; cell_dim <= mesh->dim(); ++cell_dim) {
    cand_codes =
        check_collapse_exposure(mesh, cands2edges, cand_codes, cell_dim);
  }
  return mesh->sync_subset_array(
      EDGE, cand_codes, cands2edges, I8(DONT_COLLAPSE), 1);
}